

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

_Bool mpack_expect_map_or_nil(mpack_reader_t *reader,uint32_t *count)

{
  uint32_t uVar1;
  _Bool _Var2;
  mpack_tag_t mVar3;
  
  mVar3 = mpack_read_tag(reader);
  uVar1 = mVar3.v._0_4_;
  if (mVar3.type != mpack_type_nil) {
    if (mVar3.type == mpack_type_map) {
      _Var2 = true;
      goto LAB_001082eb;
    }
    uVar1 = 0;
    _Var2 = false;
    if (reader->error != mpack_ok) goto LAB_001082eb;
    reader->error = mpack_error_type;
    reader->end = reader->data;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_type);
    }
  }
  uVar1 = 0;
  _Var2 = false;
LAB_001082eb:
  *count = uVar1;
  return _Var2;
}

Assistant:

bool mpack_expect_map_or_nil(mpack_reader_t* reader, uint32_t* count) {
    mpack_assert(count != NULL, "count cannot be NULL");

    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_nil) {
        *count = 0;
        return false;
    }
    if (var.type == mpack_type_map) {
        *count = var.v.n;
        return true;
    }
    mpack_reader_flag_error(reader, mpack_error_type);
    *count = 0;
    return false;
}